

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

matrix * __thiscall matrix::operator=(matrix *this,matrix *v)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  int j;
  long lVar7;
  
  iVar1 = v->nl_;
  this->nl_ = iVar1;
  this->nc_ = v->nc_;
  lVar3 = (long)v->nl_;
  if (0 < lVar3) {
    pdVar4 = v->data_;
    iVar2 = v->nc_;
    pdVar5 = this->data_;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        pdVar5[lVar7] = pdVar4[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar3 != lVar7);
      lVar6 = lVar6 + 1;
      pdVar5 = pdVar5 + iVar1;
      pdVar4 = pdVar4 + iVar2;
    } while (lVar6 != lVar3);
  }
  return this;
}

Assistant:

matrix& matrix::operator= (const matrix& v){
    nl_ = v.get_nl();
    nc_ = v.get_nc();
    for(int i = 0; i < v.get_nl(); i++){
        for(int j = 0; j < v.get_nl(); j++){
            data_[i*get_nl()+j] = v(i, j);
        }
    }
    return *this;
}